

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

object_validator __thiscall goodform::sub_form::object(sub_form *this)

{
  bool bVar1;
  undefined1 *puVar2;
  object_validator oVar3;
  allocator<char> local_51;
  string local_50;
  error_message local_30;
  
  bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                    (this->variant_);
  if (bVar1) {
    puVar2 = (undefined1 *)
             std::
             any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>const&>
                       (this->variant_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"NOT AN OBJECT",&local_51);
    error_message::error_message(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    puVar2 = const_object_abi_cxx11_;
  }
  oVar3.value_ = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  *)puVar2;
  oVar3.error_ = this->error_;
  return oVar3;
}

Assistant:

object_validator sub_form::object()
  {
    if (!is<goodform::object_t>(this->variant_))
    {
      this->error_ = error_message("NOT AN OBJECT");
      return object_validator(const_object, this->error_);
    }
    else
    {
      return object_validator(get<goodform::object_t>(this->variant_), this->error_);
    }
  }